

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  cmake *pcVar1;
  pointer ppcVar2;
  bool bVar3;
  char *pcVar4;
  cmMakefile *pcVar5;
  ostream *poVar6;
  pointer gti;
  uint uVar7;
  __hashtable *__h;
  char **log;
  undefined **ppuVar8;
  allocator local_549;
  cmMakefile *dirMf;
  string f;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  cmStateSnapshot snapshot;
  ostringstream msg;
  char num [100];
  
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  pcVar1 = this->CMakeInstance;
  snapshot.Position.Position = (pcVar1->CurrentSnapshot).Position.Position;
  snapshot.State = (pcVar1->CurrentSnapshot).State;
  snapshot.Position.Tree = (pcVar1->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&msg,&snapshot);
  pcVar4 = cmake::GetHomeDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)num,pcVar4,(allocator *)&f);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&msg,(string *)num);
  std::__cxx11::string::~string((string *)num);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&msg,&snapshot);
  pcVar4 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)num,pcVar4,(allocator *)&f);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&msg,(string *)num);
  std::__cxx11::string::~string((string *)num);
  pcVar5 = (cmMakefile *)operator_new(0x760);
  cmMakefile::cmMakefile(pcVar5,this,&snapshot);
  dirMf = pcVar5;
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back(&this->Makefiles,&dirMf);
  IndexMakefile(this,dirMf);
  pcVar4 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)&msg,pcVar4,(allocator *)num);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure(dirMf);
  cmMakefile::EnforceDirectoryLevelRules(dirMf);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CreateDefaultGlobalTargets(this,&globalTargets);
  uVar7 = 0;
  while( true ) {
    ppcVar2 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->Makefiles).
                      super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppcVar2 >> 3) <= (ulong)uVar7)
    break;
    pcVar5 = ppcVar2[uVar7];
    for (gti = globalTargets.
               super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
        gti != globalTargets.
               super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish; gti = gti + 1) {
      CreateGlobalTarget((cmTarget *)num,this,gti,pcVar5);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmTarget,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
                  *)&msg,&gti->Name,(cmTarget *)num);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,cmTarget>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pcVar5->Targets,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
                  *)&msg);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
               *)&msg);
      cmTarget::~cmTarget((cmTarget *)num);
    }
    uVar7 = uVar7 + 1;
  }
  sprintf(num,"%d");
  pcVar1 = this->CMakeInstance;
  std::__cxx11::string::string((string *)&msg,"CMAKE_NUMBER_OF_MAKEFILES",(allocator *)&f);
  cmake::AddCacheEntry(pcVar1,(string *)&msg,num,"number of local generators",4);
  std::__cxx11::string::~string((string *)&msg);
  CheckTargetProperties(this);
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    bVar3 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar3) {
      std::operator<<((ostream *)&msg,"Configuring incomplete, errors occurred!");
      for (ppuVar8 = &PTR_anon_var_dwarf_249933_00651420; *ppuVar8 != (undefined *)0x0;
          ppuVar8 = ppuVar8 + 1) {
        pcVar4 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
        std::__cxx11::string::string((string *)&f,pcVar4,&local_549);
        std::__cxx11::string::append((char *)&f);
        std::__cxx11::string::append((char *)&f);
        std::__cxx11::string::append((char *)&f);
        bVar3 = cmsys::SystemTools::FileExists(f._M_dataplus._M_p);
        if (bVar3) {
          poVar6 = std::operator<<((ostream *)&msg,"\nSee also \"");
          poVar6 = std::operator<<(poVar6,(string *)&f);
          std::operator<<(poVar6,"\".");
        }
        std::__cxx11::string::~string((string *)&f);
      }
    }
    else {
      std::operator<<((ostream *)&msg,"Configuring done");
    }
    pcVar1 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar1,f._M_dataplus._M_p,-1.0);
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector(&globalTargets);
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  cmMakefile* dirMf = new cmMakefile(this, snapshot);
  this->Makefiles.push_back(dirMf);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  std::vector<GlobalTargetInfo> globalTargets;
  this->CreateDefaultGlobalTargets(globalTargets);

  for (unsigned int i = 0; i < this->Makefiles.size(); ++i) {
    cmMakefile* mf = this->Makefiles[i];
    cmTargets* targets = &(mf->GetTargets());
    for (std::vector<GlobalTargetInfo>::iterator gti = globalTargets.begin();
         gti != globalTargets.end(); ++gti) {
      targets->insert(
        cmTargets::value_type(gti->Name, this->CreateGlobalTarget(*gti, mf)));
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  sprintf(num, "%d", static_cast<int>(this->Makefiles.size()));
  this->GetCMakeInstance()->AddCacheEntry("CMAKE_NUMBER_OF_MAKEFILES", num,
                                          "number of local generators",
                                          cmStateEnums::INTERNAL);

  // check for link libraries and include directories containing "NOTFOUND"
  // and for infinite loops
  this->CheckTargetProperties();

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccuredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = { "CMakeOutput.log", "CMakeError.log", CM_NULLPTR };
      for (const char** log = logs; *log; ++log) {
        std::string f = this->CMakeInstance->GetHomeOutputDirectory();
        f += this->CMakeInstance->GetCMakeFilesDirectory();
        f += "/";
        f += *log;
        if (cmSystemTools::FileExists(f.c_str())) {
          msg << "\nSee also \"" << f << "\".";
        }
      }
    } else {
      msg << "Configuring done";
    }
    this->CMakeInstance->UpdateProgress(msg.str().c_str(), -1);
  }
}